

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O0

C_Node * new_var_node(C_Parser *parser,C_Obj *var,C_Token *tok)

{
  C_Node *pCVar1;
  C_Node *node;
  C_Token *tok_local;
  C_Obj *var_local;
  C_Parser *parser_local;
  
  pCVar1 = new_node(parser,ND_VAR,tok);
  pCVar1->var = var;
  return pCVar1;
}

Assistant:

static C_Node *new_var_node(C_Parser *parser, C_Obj *var, C_Token *tok) {
  C_Node *node = new_node(parser, ND_VAR, tok);
  node->var = var;
  return node;
}